

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O3

bool __thiscall ON_ParseSettings::IsUnaryPlus(ON_ParseSettings *this,ON__UINT32 c)

{
  byte bVar1;
  
  if ((int)c < 0xfe0b) {
    if (c == 0x2b) {
      bVar1 = *(byte *)((long)this->m_true_default_bits + 5) & 0x10;
    }
    else {
      if (c != 0x2795) {
        return false;
      }
      bVar1 = *(byte *)((long)this->m_true_default_bits + 5) & 0x20;
    }
  }
  else if (c == 0xfe0b) {
    bVar1 = *(byte *)((long)this->m_true_default_bits + 5) & 0x80;
  }
  else {
    if (c != 0xfe62) {
      return false;
    }
    bVar1 = *(byte *)((long)this->m_true_default_bits + 5) & 0x40;
  }
  if (bVar1 != 0) {
    return false;
  }
  return true;
}

Assistant:

bool ON_ParseSettings::IsUnaryPlus(ON__UINT32 c) const
{
  switch(c)
  {
  case 0x002B: // plus
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_plus_as_unary_plus) )
      return true;
    break;

  case 0x2795: // heavy plus sign
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_heavy_plus_as_unary_plus) )
      return true;
    break;

  case 0xFE62: // small plus sign
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_small_plus_as_unary_plus) )
      return true;
    break;

  case 0xFE0B: // fullwidth plus sign
    if ( ON_ParseNumberSettingsBitTrueDefault(bitdex_true_default::parse_fullwidth_plus_as_unary_plus) )
      return true;
    break;
  }
  return false;
}